

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuperCardPro.cpp
# Opt level: O0

bool __thiscall SuperCardPro::GetDriveStatus(SuperCardPro *this,int *status)

{
  bool bVar1;
  unsigned_short uVar2;
  unsigned_short local_22;
  uint *puStack_20;
  uint16_t drv_status;
  int *status_local;
  SuperCardPro *this_local;
  
  puStack_20 = (uint *)status;
  status_local = (int *)this;
  bVar1 = SendCmd(this,0x8e,(void *)0x0,0,(void *)0x0,0);
  if (bVar1) {
    bVar1 = ReadExact(this,&local_22,2);
    if (bVar1) {
      uVar2 = util::betoh<unsigned_short>(local_22);
      *puStack_20 = (uint)uVar2;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SuperCardPro::GetDriveStatus(int& status)
{
    uint16_t drv_status;

    if (!SendCmd(CMD_STATUS))
        return false;

    if (!ReadExact(&drv_status, sizeof(drv_status)))
        return false;

    status = util::betoh(drv_status);

    return true;
}